

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O1

void __thiscall iDynTree::MatrixDynSize::fillColMajorBuffer(MatrixDynSize *this,double *colMajorBuf)

{
  size_t sVar1;
  size_t sVar2;
  double *pdVar3;
  size_t sVar4;
  double *pdVar5;
  size_t sVar6;
  
  sVar1 = this->m_rows;
  if (sVar1 != 0) {
    pdVar3 = this->m_data;
    sVar2 = this->m_cols;
    sVar4 = 0;
    do {
      if (sVar2 != 0) {
        sVar6 = 0;
        pdVar5 = colMajorBuf;
        do {
          *pdVar5 = pdVar3[sVar6];
          sVar6 = sVar6 + 1;
          pdVar5 = pdVar5 + sVar1;
        } while (sVar2 != sVar6);
      }
      sVar4 = sVar4 + 1;
      colMajorBuf = colMajorBuf + 1;
      pdVar3 = pdVar3 + sVar2;
    } while (sVar4 != sVar1);
  }
  return;
}

Assistant:

void MatrixDynSize::fillColMajorBuffer(double* colMajorBuf) const
{
    for(std::size_t row = 0; row < this->rows(); row++ )
    {
        for(std::size_t col = 0; col < this->cols(); col++ )
        {
            colMajorBuf[this->rawIndexColMajor(row,col)] =
                this->m_data[this->rawIndexRowMajor(row,col)];
        }
    }
}